

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O1

void __thiscall LowererMD::GenerateTruncWithCheck<false>(LowererMD *this,Instr *instr)

{
  Opnd *dstOpnd;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  undefined4 *puVar4;
  Opnd *src1Opnd;
  IntConstOpnd *pIVar5;
  LabelInstr *target;
  intptr_t constAddr;
  RegOpnd *pRVar6;
  Instr *pIVar7;
  
  BVar3 = AutoSystemInfo::SSE2Available(&AutoSystemInfo::Data);
  if (BVar3 == 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0x13a5,"(AutoSystemInfo::Data.SSE2Available())",
                       "AutoSystemInfo::Data.SSE2Available()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  src1Opnd = GenerateTruncChecks<false>(this,instr,(LabelInstr *)0x0);
  dstOpnd = instr->m_dst;
  bVar2 = IRType_IsUnsignedInt(dstOpnd->m_type);
  if (bVar2) {
    pIVar5 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
    Lowerer::InsertMove(dstOpnd,&pIVar5->super_Opnd,instr,true);
    target = IR::LabelInstr::New(Label,this->m_func,false);
    constAddr = ThreadContextInfo::GetDoubleTwoTo31Addr(this->m_func->m_threadContextInfo);
    pRVar6 = MaterializeDoubleConstFromInt(this,constAddr,instr);
    Lowerer::InsertCompareBranch
              (this->m_lowerer,src1Opnd,&pRVar6->super_Opnd,BrLt_A,target,instr,false);
    pIVar7 = IR::Instr::New(SUBPD,src1Opnd,src1Opnd,&pRVar6->super_Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    pIVar5 = IR::IntConstOpnd::New(0x80000000,TyUint32,this->m_func,false);
    Lowerer::InsertMove(dstOpnd,&pIVar5->super_Opnd,instr,true);
    IR::Instr::InsertBefore(instr,&target->super_Instr);
    pRVar6 = IR::RegOpnd::New(TyInt32,this->m_func);
    pIVar7 = IR::Instr::New(CVTTSD2SI,&pRVar6->super_Opnd,src1Opnd,this->m_func);
    IR::Instr::InsertBefore(instr,pIVar7);
    pIVar7 = IR::Instr::New(ADD,dstOpnd,dstOpnd,&pRVar6->super_Opnd,this->m_func);
  }
  else {
    pIVar7 = IR::Instr::New(CVTTSD2SI,dstOpnd,src1Opnd,this->m_func);
  }
  IR::Instr::InsertBefore(instr,pIVar7);
  IR::Instr::UnlinkSrc1(instr);
  IR::Instr::UnlinkDst(instr);
  IR::Instr::Remove(instr);
  return;
}

Assistant:

void
LowererMD::GenerateTruncWithCheck(_In_ IR::Instr * instr)
{
    Assert(AutoSystemInfo::Data.SSE2Available());

    IR::LabelInstr * doneLabel = Saturate ? IR::LabelInstr::New(Js::OpCode::Label, m_func) : nullptr;
    IR::Opnd* src64 = GenerateTruncChecks<Saturate>(instr, doneLabel); //converts src to double and checks if  MIN <= src <= MAX

    IR::Opnd* dst = instr->GetDst();

    if (dst->IsUnsigned())
    {
        m_lowerer->InsertMove(dst, IR::IntConstOpnd::New(0, TyUint32, m_func), instr);
        IR::LabelInstr * skipUnsignedPart = IR::LabelInstr::New(Js::OpCode::Label, m_func);
        IR::Opnd* twoTo31 = MaterializeDoubleConstFromInt(m_func->GetThreadContextInfo()->GetDoubleTwoTo31Addr(), instr);
        m_lowerer->InsertCompareBranch(src64, twoTo31, Js::OpCode::BrLt_A, skipUnsignedPart, instr);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::SUBPD, src64, src64, twoTo31, m_func));
        m_lowerer->InsertMove(dst, IR::IntConstOpnd::New(0x80000000 /*2^31*/, TyUint32, m_func), instr);
        instr->InsertBefore(skipUnsignedPart);
        IR::Opnd* tmp = IR::RegOpnd::New(TyInt32, m_func);
        instr->InsertBefore(IR::Instr::New(Js::OpCode::CVTTSD2SI, tmp, src64, m_func));
        instr->InsertBefore(IR::Instr::New(Js::OpCode::ADD, dst, dst, tmp, m_func));
    }
    else
    {
        instr->InsertBefore(IR::Instr::New(Js::OpCode::CVTTSD2SI, dst, src64, m_func));
    }
    if (Saturate)
    {
        instr->InsertBefore(doneLabel);
    }
    instr->UnlinkSrc1();
    instr->UnlinkDst();
    instr->Remove();
}